

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O2

bool __thiscall cmCTest::AddIfExists(cmCTest *this,Part part,string *file)

{
  bool bVar1;
  string name;
  string local_a0;
  cmAlphaNum local_80;
  cmAlphaNum local_50;
  
  bVar1 = CTestFileExists(this,file);
  if (bVar1) {
    AddSubmitFile(this,part,file);
  }
  else {
    local_50.View_._M_str = (file->_M_dataplus)._M_p;
    local_50.View_._M_len = file->_M_string_length;
    local_80.View_._M_len = 3;
    local_80.View_._M_str = ".gz";
    cmStrCat<>(&local_a0,&local_50,&local_80);
    bVar1 = CTestFileExists(this,&local_a0);
    if (!bVar1) {
      std::__cxx11::string::~string((string *)&local_a0);
      return false;
    }
    AddSubmitFile(this,part,file);
    std::__cxx11::string::~string((string *)&local_a0);
  }
  return true;
}

Assistant:

bool cmCTest::AddIfExists(Part part, const std::string& file)
{
  if (this->CTestFileExists(file)) {
    this->AddSubmitFile(part, file);
  } else {
    std::string name = cmStrCat(file, ".gz");
    if (this->CTestFileExists(name)) {
      this->AddSubmitFile(part, file);
    } else {
      return false;
    }
  }
  return true;
}